

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollAdapterBase.cpp
# Opt level: O3

void __thiscall
cursespp::ScrollAdapterBase::DrawPage
          (ScrollAdapterBase *this,ScrollableWindow *scrollable,size_t index,ScrollPosition *result)

{
  shared_ptr<cursespp::IScrollAdapter::IEntry> *__args_3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  long lVar5;
  reference pvVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  result_00;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar12;
  undefined8 uVar13;
  size_t sVar14;
  string line;
  deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  visible;
  _Any_data local_130;
  wchar_t local_120;
  undefined4 uStack_11c;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_110;
  ScrollableWindow *local_108;
  ulong local_100;
  wchar_t *local_f8;
  undefined8 local_f0;
  utf8 *local_e8;
  long local_e0;
  long local_d8 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  ulong local_b8;
  ScrollPosition *local_b0;
  size_t local_a8;
  ulong local_a0;
  ScrollableWindow *local_98;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_90;
  _Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  local_88;
  long lVar3;
  
  local_b0 = result;
  iVar1 = (*(scrollable->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x22])
                    (scrollable);
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_108 = scrollable;
  iVar1 = (*(scrollable->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x23])
                    (scrollable);
  if ((((lVar3 != 0) && ((char)iVar1 != '\0')) && (this->height != 0)) && (this->width != 0)) {
    werase(lVar3);
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::_M_initialize_map(&local_88,0);
    iVar1 = (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[3])(this);
    local_b8 = CONCAT44(extraout_var_00,iVar1);
    if (local_b8 == 0) {
      lVar5 = (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
              (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node >> 3;
      lVar11 = (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 4;
      lVar7 = (long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 4;
      sVar4 = 0;
      sVar14 = 0;
    }
    else {
      sVar4 = local_b8 - 1;
      if (index < local_b8) {
        sVar4 = index;
      }
      sVar4 = GetVisibleItems(this,local_108,sVar4,
                              (deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                               *)&local_88);
      local_98 = (ScrollableWindow *)&this->decorator;
      uVar10 = 0;
      sVar14 = 0;
      local_a8 = sVar4;
      while( true ) {
        lVar5 = (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node >> 3;
        lVar11 = (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 4;
        lVar7 = (long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 4;
        if ((lVar5 + -1 +
            (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
            * 0x20 + lVar11 + lVar7 <= uVar10) break;
        pvVar6 = std::
                 deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                 ::at((deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                       *)&local_88,uVar10);
        result_00.container =
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             (pvVar6->
             super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
        this_00 = (pvVar6->
                  super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_110 = result_00.container;
        iVar1 = (**(_func_int **)((long)((result_00.container)->_M_dataplus)._M_p + 0x10))();
        local_100 = CONCAT44(extraout_var_01,iVar1);
        wmove(lVar3,sVar14 & 0xffffffff,0);
        if ((local_100 != 0) && (sVar14 < this->height)) {
          local_90 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     (sVar4 + uVar10);
          uVar8 = 1;
          pbVar12 = local_110;
          local_a0 = uVar10;
          do {
            __args_3 = (shared_ptr<cursespp::IScrollAdapter::IEntry> *)(uVar8 - 1);
            if ((this->decorator).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00179dd8:
              iVar1 = (**(_func_int **)((long)(pbVar12->_M_dataplus)._M_p + 0x28))
                                (&local_130,pbVar12,__args_3);
              uVar13 = local_130._M_unused._0_8_;
              if ((wchar_t *)local_130._M_unused._0_8_ != (wchar_t *)0xffffffffffffffff)
              goto LAB_00179df5;
              local_f8 = (wchar_t *)0xffffffffffffffff;
              local_f0 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar1) >> 8),1);
            }
            else {
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              result_00.container = local_90;
              local_c8 = pbVar12;
              local_c0 = this_00;
              std::
              function<cursespp::Color_(cursespp::ScrollableWindow_*,_unsigned_long,_unsigned_long,_std::shared_ptr<cursespp::IScrollAdapter::IEntry>)>
              ::operator()((function<cursespp::Color_(cursespp::ScrollableWindow_*,_unsigned_long,_unsigned_long,_std::shared_ptr<cursespp::IScrollAdapter::IEntry>)>
                            *)&local_130,local_98,(unsigned_long)local_108,(unsigned_long)local_90,
                           __args_3);
              uVar13 = local_130._M_unused._0_8_;
              if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
              }
              if ((wchar_t *)uVar13 == (wchar_t *)0xffffffffffffffff) goto LAB_00179dd8;
LAB_00179df5:
              local_f0 = 0;
              local_f8 = (wchar_t *)uVar13;
              wattr_on(lVar3,uVar13 & 0xffffffff,0);
            }
            (**(_func_int **)((long)(pbVar12->_M_dataplus)._M_p + 0x18))(&local_e8,pbVar12,__args_3)
            ;
            local_130._8_8_ = 0;
            local_120 = L'\0';
            local_130._M_unused._M_object = &local_120;
            utf8::
            utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (local_e8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_e8 + local_e0),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&local_130,result_00);
            iVar2 = wcswidth((wchar_t *)local_130._M_unused._0_8_,local_130._8_8_);
            iVar1 = (int)local_e0;
            if ((wchar_t *)local_130._M_unused._0_8_ != &local_120) {
              operator_delete(local_130._M_unused._M_object,CONCAT44(uStack_11c,local_120) * 4 + 4);
            }
            pbVar12 = local_110;
            if (0 < iVar2) {
              iVar1 = iVar2;
            }
            iVar1 = (int)this->width - iVar1;
            if (0 < iVar1) {
              local_130._M_unused._M_object = &local_120;
              std::__cxx11::string::_M_construct((ulong)&local_130,(char)iVar1);
              std::__cxx11::string::_M_append
                        ((char *)&local_e8,local_130._M_unused._M_member_pointer);
              if ((wchar_t *)local_130._M_unused._0_8_ != &local_120) {
                operator_delete(local_130._M_unused._M_object,CONCAT44(uStack_11c,local_120) + 1);
              }
            }
            wprintw(lVar3,"%s",local_e8);
            if ((char)local_f0 == '\0') {
              wattr_off(lVar3,local_f8,0);
            }
            if (local_e8 != (utf8 *)local_d8) {
              operator_delete(local_e8,local_d8[0] + 1);
            }
            uVar10 = uVar8 + 1;
          } while ((uVar8 < local_100) &&
                  (uVar9 = uVar8 + sVar14, uVar8 = uVar10, uVar9 < this->height));
          sVar14 = (sVar14 + uVar10) - 1;
          sVar4 = local_a8;
          uVar10 = local_a0;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        uVar10 = uVar10 + 1;
      }
    }
    local_b0->visibleEntryCount =
         lVar7 + lVar11 +
         (lVar5 + -1 +
         (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
         0x20;
    local_b0->firstVisibleEntryIndex = sVar4;
    local_b0->lineCount = sVar14;
    local_b0->totalEntries = local_b8;
    std::
    deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::~deque((deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
              *)&local_88);
  }
  return;
}

Assistant:

void ScrollAdapterBase::DrawPage(ScrollableWindow* scrollable, size_t index, ScrollPosition& result) {
    WINDOW* window = scrollable->GetContent();

    if (!scrollable->IsVisible() || !window || this->height == 0 || this->width == 0) {
        return;
    }

    werase(window);

    std::deque<EntryPtr> visible;
    size_t drawnLines = 0;
    size_t topIndex = 0;
    size_t count = GetEntryCount();

    if (count > 0) {
        if (index >= count) {
            index = count - 1;
        }

        topIndex = GetVisibleItems(scrollable, index, visible);

        for (size_t e = 0; e < visible.size(); e++) {
            EntryPtr entry = visible.at(e);
            size_t count = entry->GetLineCount();
            wmove(window, drawnLines, 0);

            for (size_t i = 0; i < count && drawnLines < this->height; i++) {
                Color attrs = Color::Default;

                if (this->decorator) {
                    attrs = this->decorator(scrollable, topIndex + e, i, entry);
                }

                if (attrs == -1) {
                    attrs = entry->GetAttrs(i);
                }

                if (attrs != -1) {
                    wattron(window, attrs);
                }

                std::string line = entry->GetLine(i);
                size_t len = u8cols(line);

                /* pad with empty spaces to the end of the line. this allows us to
                do highlight rows. this should probably be configurable. */

                int remain = this->width - len;
                if (remain > 0) {
                    line += std::string(remain, ' ');
                }

                /* string is padded above, we don't need a \n */
                checked_wprintw(window, "%s", line.c_str());

                if (attrs != -1) {
                    wattroff(window, attrs);
                }

                ++drawnLines;
            }
        }
    }

    result.visibleEntryCount = visible.size();
    result.firstVisibleEntryIndex = topIndex;
    result.lineCount = drawnLines;
    result.totalEntries = count;
}